

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O3

bool DoDehPatch(void)

{
  Variant *pVVar1;
  BYTE *pBVar2;
  DEHSprName *pDVar3;
  StateMapper *pSVar4;
  BitName *pBVar5;
  StyleName *pSVar6;
  CodePointerAlias *pCVar7;
  char *__s1;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  FStringTable *this;
  long lVar13;
  DObject *p;
  PFunction *pPVar14;
  size_t sVar15;
  PClassActor *pPVar16;
  PClass *pPVar17;
  FState *pFVar18;
  PClass *pPVar19;
  PClassAmmo *pPVar20;
  long lVar21;
  ulong uVar22;
  PClassActor *pPVar23;
  char *pcVar24;
  anon_struct_16_2_3f885e32 *paVar25;
  FString name;
  FScanner sc;
  FString local_170;
  undefined4 uStack_168;
  undefined1 uStack_164;
  undefined1 uStack_163;
  undefined2 uStack_162;
  undefined1 uStack_160;
  undefined2 uStack_15f;
  undefined1 uStack_15d;
  undefined1 uStack_15c;
  undefined1 uStack_15b;
  undefined1 uStack_15a;
  undefined1 uStack_159;
  undefined1 uStack_158;
  FName local_150;
  FName local_14c;
  undefined1 local_148 [16];
  FScanner local_130;
  
  if (!batchrun) {
    Printf("Adding dehacked patch %s\n",PatchName);
  }
  pcVar24 = PatchFile;
  pversion = -1;
  dversion = -1;
  iVar9 = strncmp(PatchFile,"Patch File for DeHackEd v",0x19);
  if (iVar9 == 0) {
    if ((pcVar24[0x19] < '2') && (pcVar24[0x1b] != '3')) {
      Printf(200,"\"%s\" is an old and unsupported DeHackEd patch\n",PatchName);
      goto LAB_004b101a;
    }
    lVar13 = (long)PatchSize;
    if (0 < lVar13) {
      lVar21 = 0;
      do {
        if (pcVar24[lVar21] == '\0') {
          pcVar24[lVar21] = ' ';
        }
        lVar21 = lVar21 + 1;
      } while (lVar13 != lVar21);
    }
    PatchPt = strchr(pcVar24,10);
    iVar9 = GetLine();
    if (iVar9 != 1) {
LAB_004b1130:
      if (PatchName != (char *)0x0) {
        operator_delete__(PatchName);
        pcVar24 = PatchFile;
      }
      if (pcVar24 == (char *)0x0) {
        pcVar24 = (char *)0x0;
      }
      else {
        operator_delete__(pcVar24);
        pcVar24 = PatchFile;
      }
      Printf(200,"\"%s\" is not a DeHackEd patch file\n",pcVar24);
      return false;
    }
    uVar12 = 0xffffffff;
    iVar10 = -1;
    do {
      __s1 = Line1;
      iVar9 = strcasecmp(Line1,"Doom version");
      if (iVar9 == 0) {
        iVar10 = atoi(Line2);
        dversion = iVar10;
      }
      else {
        iVar9 = strcasecmp(__s1,"Patch format");
        if (iVar9 == 0) {
          uVar12 = atoi(Line2);
          pversion = uVar12;
        }
      }
      iVar9 = GetLine();
    } while (iVar9 == 1);
    if ((uVar12 == 0xffffffff || iVar10 == -1) || iVar9 == 0) goto LAB_004b1130;
    if (uVar12 - 7 < 0xfffffffe) {
      Printf("DeHackEd patch version is %d.\nUnexpected results may occur.\n",(ulong)uVar12);
      iVar10 = dversion;
    }
    switch(iVar10) {
    case 0x10:
      dversion = 0;
      break;
    case 0x11:
      dversion = 2;
      break;
    default:
      Printf("Patch created with unknown DOOM version.\nAssuming version 1.9.\n");
    case 0x13:
switchD_004b1fe2_caseD_13:
      dversion = 3;
      break;
    case 0x14:
      dversion = 1;
      break;
    case 0x15:
      dversion = 4;
    }
    iVar10 = FWadCollection::CheckNumForName(&Wads,"DEHSUPP",0);
    if (iVar10 != -1) {
      iVar11 = FWadCollection::GetLumpFile(&Wads,iVar10);
      if (iVar11 < 1) {
        iVar11 = DehUseCount + 1;
        bVar8 = DehUseCount < 1;
        DehUseCount = iVar11;
        if (bVar8) {
          if (EnglishStrings == (FStringTable *)0x0) {
            this = (FStringTable *)operator_new(0x400);
            FStringTable::FStringTable(this);
            EnglishStrings = this;
            FStringTable::LoadStrings(this,true);
          }
          uVar12 = sprites.Count;
          if (UnchangedSpriteNames == (char *)0x0) {
            UnchangedSpriteNames = (char *)operator_new__((ulong)(sprites.Count * 4));
            NumUnchangedSprites = uVar12;
            if (0 < (int)uVar12) {
              lVar13 = 0;
              lVar21 = 0;
              do {
                *(undefined4 *)(UnchangedSpriteNames + lVar21 * 4) =
                     *(undefined4 *)((long)&(sprites.Array)->field_0 + lVar13);
                lVar21 = lVar21 + 1;
                lVar13 = lVar13 + 0xc;
              } while (lVar21 < NumUnchangedSprites);
            }
          }
          FScanner::FScanner(&local_130);
          FScanner::OpenLumpNum(&local_130,iVar10);
          FScanner::SetCMode(&local_130,true);
          while (bVar8 = FScanner::GetString(&local_130), bVar8) {
            bVar8 = FScanner::Compare(&local_130,"ActionList");
            if (bVar8) {
              FScanner::MustGetStringName(&local_130,"{");
              while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                FScanner::MustGetString(&local_130);
                bVar8 = FScanner::Compare(&local_130,"NULL");
                if (bVar8) {
                  TArray<PFunction_*,_PFunction_*>::Grow(&Actions,1);
                  Actions.Array[Actions.Count] = (PFunction *)0x0;
                  Actions.Count = Actions.Count + 1;
                }
                else {
                  FString::FString(&local_170,"A_");
                  FString::operator+=(&local_170,local_130.String);
                  pPVar19 = AInventory::RegistrationInfo.MyClass;
                  local_14c.Index =
                       FName::NameManager::FindName
                                 (&FName::NameData,
                                  (char *)CONCAT44(local_170.Chars._4_4_,(int)local_170.Chars),
                                  (ulong)*(uint *)((char *)CONCAT44(local_170.Chars._4_4_,
                                                                    (int)local_170.Chars) + -0xc),
                                  false);
                  p = &PSymbolTable::FindSymbol
                                 (&(pPVar19->super_PStruct).super_PNamedType.super_PCompoundType.
                                   super_PType.Symbols,&local_14c,true)->super_DObject;
                  pPVar14 = dyn_cast<PFunction>(p);
                  if (pPVar14 == (PFunction *)0x0) {
                    FScanner::ScriptError(&local_130,"Unknown code pointer \'%s\'",local_130.String)
                    ;
                  }
                  else if (((~pPVar14->Flags & 6) != 0) ||
                          ((pVVar1 = (pPVar14->Variants).Array, 3 < (pVVar1->ArgFlags).Count &&
                           (((pVVar1->ArgFlags).Array[3] & 1) == 0)))) {
                    FScanner::ScriptMessage
                              (&local_130,"Incompatible code pointer \'%s\'",local_130.String);
                  }
                  TArray<PFunction_*,_PFunction_*>::Grow(&Actions,1);
                  Actions.Array[Actions.Count] = pPVar14;
                  Actions.Count = Actions.Count + 1;
                  FString::~FString(&local_170);
                }
                bVar8 = FScanner::CheckString(&local_130,"}");
                if (bVar8) break;
                FScanner::MustGetStringName(&local_130,",");
              }
            }
            else {
              bVar8 = FScanner::Compare(&local_130,"OrgHeights");
              if (bVar8) {
                FScanner::MustGetStringName(&local_130,"{");
                while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                  FScanner::MustGetNumber(&local_130);
                  TArray<int,_int>::Grow(&OrgHeights,1);
                  OrgHeights.Array[OrgHeights.Count] = local_130.Number;
                  OrgHeights.Count = OrgHeights.Count + 1;
                  bVar8 = FScanner::CheckString(&local_130,"}");
                  if (bVar8) break;
                  FScanner::MustGetStringName(&local_130,",");
                }
              }
              else {
                bVar8 = FScanner::Compare(&local_130,"CodePConv");
                if (bVar8) {
                  FScanner::MustGetStringName(&local_130,"{");
                  while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                    FScanner::MustGetNumber(&local_130);
                    TArray<int,_int>::Grow(&CodePConv,1);
                    CodePConv.Array[CodePConv.Count] = local_130.Number;
                    CodePConv.Count = CodePConv.Count + 1;
                    bVar8 = FScanner::CheckString(&local_130,"}");
                    if (bVar8) break;
                    FScanner::MustGetStringName(&local_130,",");
                  }
                }
                else {
                  bVar8 = FScanner::Compare(&local_130,"OrgSprNames");
                  if (bVar8) {
                    FScanner::MustGetStringName(&local_130,"{");
                    while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                      FScanner::MustGetString(&local_130);
                      pcVar24 = local_130.String;
                      sVar15 = strlen(local_130.String);
                      if (sVar15 == 4) {
                        local_148 = ZEXT416(*(uint *)pcVar24);
                      }
                      else {
                        local_148 = ZEXT816(0);
                        FScanner::ScriptError
                                  (&local_130,"Invalid sprite name \'%s\' (must be 4 characters)",
                                   pcVar24);
                      }
                      TArray<DEHSprName,_DEHSprName>::Grow(&OrgSprNames,1);
                      pDVar3 = OrgSprNames.Array;
                      uVar22 = (ulong)OrgSprNames.Count;
                      *(undefined4 *)OrgSprNames.Array[uVar22].c = local_148._0_4_;
                      pDVar3[uVar22].c[4] = '\0';
                      OrgSprNames.Count = OrgSprNames.Count + 1;
                      bVar8 = FScanner::CheckString(&local_130,"}");
                      if (bVar8) break;
                      FScanner::MustGetStringName(&local_130,",");
                    }
                  }
                  else {
                    bVar8 = FScanner::Compare(&local_130,"StateMap");
                    if (bVar8) {
                      local_148._0_4_ = StateMap.Count;
                      FScanner::MustGetStringName(&local_130,"{");
                      while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                        FScanner::MustGetString(&local_130);
                        local_170.Chars._0_4_ =
                             FName::NameManager::FindName(&FName::NameData,local_130.String,true);
                        pPVar16 = (PClassActor *)PClass::FindClass((FName *)&local_170);
                        pPVar19 = PClassActor::RegistrationInfo.MyClass;
                        pcVar24 = "Can\'t find type %s";
                        if (pPVar16 == (PClassActor *)0x0) {
LAB_004b16d2:
                          FScanner::ScriptError(&local_130,pcVar24,local_130.String);
                        }
                        else {
                          pPVar17 = (pPVar16->super_PClass).super_PStruct.super_PNamedType.
                                    super_PCompoundType.super_PType.super_DObject.Class;
                          if (pPVar17 == (PClass *)0x0) {
                            pPVar17 = (PClass *)
                                      (**(pPVar16->super_PClass).super_PStruct.super_PNamedType.
                                         super_PCompoundType.super_PType.super_DObject._vptr_DObject
                                      )(pPVar16);
                            (pPVar16->super_PClass).super_PStruct.super_PNamedType.
                            super_PCompoundType.super_PType.super_DObject.Class = pPVar17;
                          }
                          bVar8 = pPVar17 != (PClass *)0x0;
                          if (pPVar17 != pPVar19 && bVar8) {
                            do {
                              pPVar17 = pPVar17->ParentClass;
                              bVar8 = pPVar17 != (PClass *)0x0;
                              if (pPVar17 == pPVar19) break;
                            } while (pPVar17 != (PClass *)0x0);
                          }
                          pcVar24 = "%s is not an actor";
                          if (!bVar8) goto LAB_004b16d2;
                        }
                        FScanner::MustGetStringName(&local_130,",");
                        FScanner::MustGetString(&local_130);
                        local_150.Index =
                             FName::NameManager::FindName(&FName::NameData,local_130.String,false);
                        pFVar18 = PClassActor::FindState(pPVar16,1,&local_150,false);
                        if (pFVar18 == (FState *)0x0) {
                          FScanner::ScriptError
                                    (&local_130,"Invalid state \'%s\' in \'%s\'",local_130.String,
                                     FName::NameData.NameArray
                                     [(pPVar16->super_PClass).super_PStruct.super_PNamedType.
                                      TypeName.Index].Text);
                        }
                        FScanner::MustGetStringName(&local_130,",");
                        FScanner::MustGetNumber(&local_130);
                        if ((pFVar18 == (FState *)0x0) ||
                           (pPVar16->OwnedStates + pPVar16->NumOwnedStates <
                            pFVar18 + local_130.Number)) {
                          FScanner::ScriptError
                                    (&local_130,"Invalid state range in \'%s\'",
                                     FName::NameData.NameArray
                                     [(pPVar16->super_PClass).super_PStruct.super_PNamedType.
                                      TypeName.Index].Text);
                        }
                        iVar10 = local_130.Number;
                        pBVar2 = (pPVar16->super_PClass).Defaults;
                        if (pBVar2 == (BYTE *)0x0) {
                          bVar8 = false;
                        }
                        else {
                          bVar8 = (bool)(pBVar2[0x18c] & 1);
                        }
                        if (local_148._0_4_ == 0) {
                          TArray<StateMapper,_StateMapper>::Grow(&StateMap,1);
                          pSVar4 = StateMap.Array;
                          uVar22 = (ulong)StateMap.Count;
                          StateMap.Array[uVar22].State = pFVar18;
                          pSVar4[uVar22].StateSpan = iVar10;
                          pSVar4[uVar22].Owner = pPVar16;
                          pSVar4[uVar22].OwnerIsPickup = bVar8;
                          StateMap.Count = StateMap.Count + 1;
                        }
                        bVar8 = FScanner::CheckString(&local_130,"}");
                        if (bVar8) break;
                        FScanner::MustGetStringName(&local_130,",");
                      }
                    }
                    else {
                      bVar8 = FScanner::Compare(&local_130,"SoundMap");
                      if (bVar8) {
                        FScanner::MustGetStringName(&local_130,"{");
                        while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                          FScanner::MustGetString(&local_130);
                          iVar10 = S_FindSound(local_130.String);
                          TArray<FSoundID,_FSoundID>::Grow(&SoundMap,1);
                          SoundMap.Array[SoundMap.Count].ID = iVar10;
                          SoundMap.Count = SoundMap.Count + 1;
                          bVar8 = FScanner::CheckString(&local_130,"}");
                          if (bVar8) break;
                          FScanner::MustGetStringName(&local_130,",");
                        }
                      }
                      else {
                        bVar8 = FScanner::Compare(&local_130,"InfoNames");
                        if (bVar8) {
                          FScanner::MustGetStringName(&local_130,"{");
                          while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                            FScanner::MustGetString(&local_130);
                            pPVar16 = PClass::FindActor(local_130.String);
                            if (pPVar16 == (PClassActor *)0x0) {
                              FScanner::ScriptError
                                        (&local_130,"Unknown actor type \'%s\'",local_130.String);
                            }
                            TArray<PClassActor_*,_PClassActor_*>::Grow(&InfoNames,1);
                            InfoNames.Array[InfoNames.Count] = pPVar16;
                            InfoNames.Count = InfoNames.Count + 1;
                            bVar8 = FScanner::CheckString(&local_130,"}");
                            if (bVar8) break;
                            FScanner::MustGetStringName(&local_130,",");
                          }
                        }
                        else {
                          bVar8 = FScanner::Compare(&local_130,"ThingBits");
                          if (bVar8) {
                            FScanner::MustGetStringName(&local_130,"{");
                            while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                              FScanner::MustGetNumber(&local_130);
                              if (0x1f < (uint)local_130.Number) {
                                FScanner::ScriptError(&local_130,"Invalid bit value %d");
                              }
                              uStack_15c = (undefined1)local_130.Number;
                              FScanner::MustGetStringName(&local_130,",");
                              FScanner::MustGetNumber(&local_130);
                              if (2 < (uint)local_130.Number) {
                                FScanner::ScriptError(&local_130,"Invalid flag word %d");
                              }
                              uStack_15b = (undefined1)local_130.Number;
                              FScanner::MustGetStringName(&local_130,",");
                              FScanner::MustGetString(&local_130);
                              strncpy((char *)&local_170,local_130.String,0x13);
                              uStack_15d = 0;
                              TArray<BitName,_BitName>::Grow(&BitNames,1);
                              pBVar5 = BitNames.Array;
                              *(ulong *)(BitNames.Array[BitNames.Count].Name + 0xe) =
                                   CONCAT17(uStack_15b,
                                            CONCAT16(uStack_15c,
                                                     CONCAT15(uStack_15d,
                                                              CONCAT23(uStack_15f,
                                                                       CONCAT12(uStack_160,
                                                                                uStack_162)))));
                              *(ulong *)pBVar5[BitNames.Count].Name =
                                   CONCAT44(local_170.Chars._4_4_,(int)local_170.Chars);
                              *(ulong *)(pBVar5[BitNames.Count].Name + 8) =
                                   CONCAT26(uStack_162,
                                            CONCAT15(uStack_163,CONCAT14(uStack_164,uStack_168)));
                              BitNames.Count = BitNames.Count + 1;
                              bVar8 = FScanner::CheckString(&local_130,"}");
                              if (bVar8) break;
                              FScanner::MustGetStringName(&local_130,",");
                            }
                          }
                          else {
                            bVar8 = FScanner::Compare(&local_130,"RenderStyles");
                            if (bVar8) {
                              FScanner::MustGetStringName(&local_130,"{");
                              while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                                FScanner::MustGetNumber(&local_130);
                                uStack_15c = (undefined1)local_130.Number;
                                FScanner::MustGetStringName(&local_130,",");
                                FScanner::MustGetString(&local_130);
                                strncpy((char *)&local_170,local_130.String,0x13);
                                uStack_15d = 0;
                                TArray<StyleName,_StyleName>::Grow(&StyleNames,1);
                                pSVar6 = StyleNames.Array;
                                *(ulong *)(StyleNames.Array[StyleNames.Count].Name + 0xd) =
                                     CONCAT17(uStack_15c,
                                              CONCAT16(uStack_15d,
                                                       CONCAT24(uStack_15f,
                                                                CONCAT13(uStack_160,
                                                                         CONCAT21(uStack_162,
                                                                                  uStack_163)))));
                                *(ulong *)pSVar6[StyleNames.Count].Name =
                                     CONCAT44(local_170.Chars._4_4_,(int)local_170.Chars);
                                *(ulong *)(pSVar6[StyleNames.Count].Name + 8) =
                                     CONCAT26(uStack_162,
                                              CONCAT15(uStack_163,CONCAT14(uStack_164,uStack_168)));
                                StyleNames.Count = StyleNames.Count + 1;
                                bVar8 = FScanner::CheckString(&local_130,"}");
                                if (bVar8) break;
                                FScanner::MustGetStringName(&local_130,",");
                              }
                            }
                            else {
                              bVar8 = FScanner::Compare(&local_130,"AmmoNames");
                              if (bVar8) {
                                FScanner::MustGetStringName(&local_130,"{");
                                while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                                  FScanner::MustGetString(&local_130);
                                  bVar8 = FScanner::Compare(&local_130,"NULL");
                                  if (bVar8) {
                                    TArray<PClassAmmo_*,_PClassAmmo_*>::Grow(&AmmoNames,1);
                                    pPVar20 = (PClassAmmo *)0x0;
                                  }
                                  else {
                                    local_170.Chars._0_4_ =
                                         FName::NameManager::FindName
                                                   (&FName::NameData,local_130.String,true);
                                    pPVar19 = PClass::FindClass((FName *)&local_170);
                                    pPVar20 = dyn_cast<PClassAmmo>((DObject *)pPVar19);
                                    if (pPVar20 == (PClassAmmo *)0x0) {
                                      FScanner::ScriptError
                                                (&local_130,"Unknown ammo type \'%s\'",
                                                 local_130.String);
                                    }
                                    TArray<PClassAmmo_*,_PClassAmmo_*>::Grow(&AmmoNames,1);
                                  }
                                  AmmoNames.Array[AmmoNames.Count] = pPVar20;
                                  AmmoNames.Count = AmmoNames.Count + 1;
                                  bVar8 = FScanner::CheckString(&local_130,"}");
                                  if (bVar8) break;
                                  FScanner::MustGetStringName(&local_130,",");
                                }
                              }
                              else {
                                bVar8 = FScanner::Compare(&local_130,"WeaponNames");
                                if (bVar8) {
                                  if (WeaponNames.Count != 0) {
                                    WeaponNames.Count = 0;
                                  }
                                  FScanner::MustGetStringName(&local_130,"{");
                                  while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                                    FScanner::MustGetString(&local_130);
                                    local_170.Chars._0_4_ =
                                         FName::NameManager::FindName
                                                   (&FName::NameData,local_130.String,true);
                                    pPVar16 = (PClassActor *)PClass::FindClass((FName *)&local_170);
                                    if (pPVar16 == (PClassActor *)0x0) {
LAB_004b1daa:
                                      FScanner::ScriptError
                                                (&local_130,"Unknown weapon type \'%s\'",
                                                 local_130.String);
                                    }
                                    else {
                                      pPVar23 = pPVar16;
                                      if (pPVar16 !=
                                          (PClassActor *)AWeapon::RegistrationInfo.MyClass) {
                                        do {
                                          pPVar23 = (PClassActor *)
                                                    (pPVar23->super_PClass).ParentClass;
                                          if (pPVar23 ==
                                              (PClassActor *)AWeapon::RegistrationInfo.MyClass)
                                          break;
                                        } while (pPVar23 != (PClassActor *)0x0);
                                        if (pPVar23 == (PClassActor *)0x0) goto LAB_004b1daa;
                                      }
                                    }
                                    TArray<PClassActor_*,_PClassActor_*>::Grow(&WeaponNames,1);
                                    WeaponNames.Array[WeaponNames.Count] = pPVar16;
                                    WeaponNames.Count = WeaponNames.Count + 1;
                                    bVar8 = FScanner::CheckString(&local_130,"}");
                                    if (bVar8) break;
                                    FScanner::MustGetStringName(&local_130,",");
                                  }
                                }
                                else {
                                  bVar8 = FScanner::Compare(&local_130,"Aliases");
                                  if (bVar8) {
                                    FScanner::MustGetStringName(&local_130,"{");
                                    while (bVar8 = FScanner::CheckString(&local_130,"}"), !bVar8) {
                                      local_170.Chars._0_4_ = 0;
                                      FScanner::MustGetString(&local_130);
                                      strncpy((char *)((long)&local_170.Chars + 4),local_130.String,
                                              0x13);
                                      uStack_159 = 0;
                                      FScanner::MustGetStringName(&local_130,",");
                                      FScanner::MustGetString(&local_130);
                                      local_170.Chars._0_4_ =
                                           FName::NameManager::FindName
                                                     (&FName::NameData,local_130.String,false);
                                      FScanner::MustGetStringName(&local_130,",");
                                      FScanner::MustGetNumber(&local_130);
                                      uStack_158 = (undefined1)local_130.Number;
                                      TArray<CodePointerAlias,_CodePointerAlias>::Grow
                                                (&MBFCodePointers,1);
                                      pCVar7 = MBFCodePointers.Array;
                                      uVar22 = (ulong)MBFCodePointers.Count;
                                      MBFCodePointers.Array[uVar22].name.Index =
                                           (int)local_170.Chars;
                                      pcVar24 = pCVar7[uVar22].alias;
                                      *(ulong *)pcVar24 = CONCAT44(uStack_168,local_170.Chars._4_4_)
                                      ;
                                      *(ulong *)(pcVar24 + 8) =
                                           CONCAT17(uStack_15d,
                                                    CONCAT25(uStack_15f,
                                                             CONCAT14(uStack_160,
                                                                      CONCAT22(uStack_162,
                                                                               CONCAT11(uStack_163,
                                                                                        uStack_164))
                                                                     )));
                                      *(ulong *)(pCVar7[uVar22].alias + 0xd) =
                                           CONCAT17(uStack_158,
                                                    CONCAT16(uStack_159,
                                                             CONCAT15(uStack_15a,
                                                                      CONCAT14(uStack_15b,
                                                                               CONCAT13(uStack_15c,
                                                                                        CONCAT12(
                                                  uStack_15d,uStack_15f))))));
                                      MBFCodePointers.Count = MBFCodePointers.Count + 1;
                                      bVar8 = FScanner::CheckString(&local_130,"}");
                                      if (bVar8) break;
                                      FScanner::MustGetStringName(&local_130,",");
                                    }
                                  }
                                  else {
                                    FScanner::ScriptError
                                              (&local_130,"Unknown section \'%s\'",local_130.String)
                                    ;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            FScanner::MustGetStringName(&local_130,";");
          }
          FScanner::~FScanner(&local_130);
        }
LAB_004b200a:
        pcVar24 = Line1;
        if (iVar9 == 2) {
          iVar9 = atoi(Line2);
          iVar10 = strcasecmp("Thing",pcVar24);
          paVar25 = Modes;
          if (iVar10 != 0) {
            lVar13 = 0;
LAB_004b203f:
            lVar21 = lVar13;
            if (lVar21 + 0x10 != 0xf0) goto code_r0x004b204c;
            Printf("Unknown chunk %s encountered. Skipping.\n",pcVar24);
            do {
              iVar9 = GetLine();
            } while (iVar9 == 1);
            goto LAB_004b2084;
          }
          goto LAB_004b2063;
        }
        if (iVar9 != 1) goto LAB_004b2084;
        Printf("Key %s encountered out of context\n",Line1);
        goto LAB_004b209f;
      }
      Printf("Warning: DEHSUPP no longer supported. DEHACKED patch disabled.\n");
    }
    Printf("Could not load DEH support data\n");
    UnloadDehSupp();
LAB_004b101a:
    if (PatchName != (char *)0x0) {
      operator_delete__(PatchName);
    }
    if (PatchFile != (char *)0x0) {
      operator_delete__(PatchFile);
    }
    return false;
  }
  DPrintf(2,"Patch does not have DeHackEd signature. Assuming .bex\n");
  dversion = 0x13;
  pversion = 6;
  PatchPt = PatchFile;
  do {
    iVar9 = GetLine();
  } while (iVar9 == 1);
  goto switchD_004b1fe2_caseD_13;
code_r0x004b204c:
  iVar10 = strcasecmp(*(char **)((long)&Modes[1].name + lVar21),pcVar24);
  lVar13 = lVar21 + 0x10;
  if (iVar10 == 0) goto code_r0x004b2060;
  goto LAB_004b203f;
code_r0x004b2060:
  paVar25 = (anon_struct_16_2_3f885e32 *)(lVar21 + 0x86ca90);
LAB_004b2063:
  iVar9 = (*paVar25->func)(iVar9);
LAB_004b2084:
  if (iVar9 == 0) {
LAB_004b209f:
    UnloadDehSupp();
    if (PatchName != (char *)0x0) {
      operator_delete__(PatchName);
    }
    if (PatchFile != (char *)0x0) {
      operator_delete__(PatchFile);
    }
    if (batchrun != false) {
      return true;
    }
    Printf("Patch installed\n");
    return true;
  }
  goto LAB_004b200a;
}

Assistant:

static bool DoDehPatch()
{
	if (!batchrun) Printf("Adding dehacked patch %s\n", PatchName);

	int cont;

	dversion = pversion = -1;
	cont = 0;
	if (0 == strncmp (PatchFile, "Patch File for DeHackEd v", 25))
	{
		if (PatchFile[25] < '3' && PatchFile[25] != '2' && PatchFile[27] != '3')
		{
			Printf (PRINT_BOLD, "\"%s\" is an old and unsupported DeHackEd patch\n", PatchName);
			delete[] PatchName;
			delete[] PatchFile;
			return false;
		}
		// fix for broken WolfenDoom patches which contain \0 characters in some places.
		for (int i = 0; i < PatchSize; i++)
		{
			if (PatchFile[i] == 0) PatchFile[i] = ' ';	
		}

		PatchPt = strchr (PatchFile, '\n');
		while ((cont = GetLine()) == 1)
		{
				 CHECKKEY ("Doom version", dversion)
			else CHECKKEY ("Patch format", pversion)
		}
		if (!cont || dversion == -1 || pversion == -1)
		{
			delete[] PatchName;
			delete[] PatchFile;
			Printf (PRINT_BOLD, "\"%s\" is not a DeHackEd patch file\n", PatchFile);
			return false;
		}
	}
	else
	{
		DPrintf (DMSG_WARNING, "Patch does not have DeHackEd signature. Assuming .bex\n");
		dversion = 19;
		pversion = 6;
		PatchPt = PatchFile;
		while ((cont = GetLine()) == 1)
		{}
	}

	if (pversion != 5 && pversion != 6)
	{
		Printf ("DeHackEd patch version is %d.\nUnexpected results may occur.\n", pversion);
	}

	if (dversion == 16)
		dversion = 0;
	else if (dversion == 17)
		dversion = 2;
	else if (dversion == 19)
		dversion = 3;
	else if (dversion == 20)
		dversion = 1;
	else if (dversion == 21)
		dversion = 4;
	else
	{
		Printf ("Patch created with unknown DOOM version.\nAssuming version 1.9.\n");
		dversion = 3;
	}

	if (!LoadDehSupp ())
	{
		Printf ("Could not load DEH support data\n");
		UnloadDehSupp ();
		delete[] PatchName;
		delete[] PatchFile;
		return false;
	}

	do
	{
		if (cont == 1)
		{
			Printf ("Key %s encountered out of context\n", Line1);
			cont = 0;
		}
		else if (cont == 2)
		{
			cont = HandleMode (Line1, atoi (Line2));
		}
	} while (cont);

	UnloadDehSupp ();
	delete[] PatchName;
	delete[] PatchFile;
	if (!batchrun) Printf ("Patch installed\n");
	return true;
}